

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeEndCoroutine(Vdbe *v,int regYield)

{
  Parse *pPVar1;
  
  sqlite3VdbeAddOp1(v,0x35,regYield);
  pPVar1 = v->pParse;
  pPVar1->nTempReg = '\0';
  pPVar1->nRangeReg = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeEndCoroutine(Vdbe *v, int regYield){
  sqlite3VdbeAddOp1(v, OP_EndCoroutine, regYield);

  /* Clear the temporary register cache, thereby ensuring that each
  ** co-routine has its own independent set of registers, because co-routines
  ** might expect their registers to be preserved across an OP_Yield, and
  ** that could cause problems if two or more co-routines are using the same
  ** temporary register.
  */
  v->pParse->nTempReg = 0;
  v->pParse->nRangeReg = 0;
}